

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O2

void __thiscall QProcEnvValue::~QProcEnvValue(QProcEnvValue *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->stringValue).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

QProcEnvValue() = default;